

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_texture_op(CompilerGLSL *this,Instruction *i,bool sparse)

{
  ushort uVar1;
  uint32_t id;
  uint32_t id_00;
  undefined1 *puVar2;
  uint32_t *puVar3;
  SPIRType *pSVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  bool forward;
  uint32_t sparse_texel_id;
  uint32_t sparse_code_id;
  SmallVector<unsigned_int,_8UL> inherited_expressions;
  string expr;
  undefined7 in_stack_fffffffffffffee0;
  byte bVar8;
  uint32_t local_118;
  uint32_t local_114;
  ulong local_110;
  undefined1 *local_108;
  long local_100;
  undefined8 local_f8;
  undefined1 local_f0 [32];
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  puVar3 = Compiler::stream(&this->super_Compiler,i);
  uVar1 = i->op;
  local_108 = local_f0;
  local_100 = 0;
  local_f8 = 8;
  local_110 = (ulong)*puVar3;
  id = puVar3[1];
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      local_110);
  local_114 = 0;
  local_118 = 0;
  if (sparse) {
    emit_sparse_feedback_temporaries(this,(uint32_t)local_110,id,&local_114,&local_118);
  }
  bVar8 = 0;
  (*(this->super_Compiler)._vptr_Compiler[0x11])(&local_b0,this,i,(ulong)sparse);
  id_00 = local_114;
  if (sparse) {
    to_expression_abi_cxx11_(&local_d0,this,local_114,true);
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (this,&local_d0,(char (*) [4])0x2f38c7,&local_b0,(char (*) [2])0x2d9bde);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_50,this,pSVar4,0);
    to_expression_abi_cxx11_(&local_70,this,id_00,true);
    to_expression_abi_cxx11_(&local_90,this,local_118,true);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
              (&local_d0,(spirv_cross *)local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f3fa1,
               (char (*) [2])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f06f8,
               (char (*) [3])&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2dfe76,
               (char (*) [2])CONCAT17(bVar8,in_stack_fffffffffffffee0));
    ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    bVar8 = 1;
    local_100 = 0;
  }
  emit_op(this,(uint32_t)local_110,id,&local_b0,(bool)(bVar8 & 1),false);
  puVar2 = local_108;
  if (local_100 != 0) {
    lVar7 = local_100 << 2;
    lVar5 = 0;
    do {
      Compiler::inherit_expression_dependencies
                (&this->super_Compiler,id,*(uint32_t *)(puVar2 + lVar5));
      lVar5 = lVar5 + 4;
    } while (lVar7 != lVar5);
  }
  uVar6 = uVar1 - 0x57;
  if ((uVar6 < 7) && ((0x55U >> (uVar6 & 0x1f) & 1) != 0)) {
    register_control_dependent_expression(this,id);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_100 = 0;
  if (local_108 != local_f0) {
    free(local_108);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_texture_op(const Instruction &i, bool sparse)
{
	auto *ops = stream(i);
	auto op = static_cast<Op>(i.op);

	SmallVector<uint32_t> inherited_expressions;

	uint32_t result_type_id = ops[0];
	uint32_t id = ops[1];
	auto &return_type = get<SPIRType>(result_type_id);

	uint32_t sparse_code_id = 0;
	uint32_t sparse_texel_id = 0;
	if (sparse)
		emit_sparse_feedback_temporaries(result_type_id, id, sparse_code_id, sparse_texel_id);

	bool forward = false;
	string expr = to_texture_op(i, sparse, &forward, inherited_expressions);

	if (sparse)
	{
		statement(to_expression(sparse_code_id), " = ", expr, ";");
		expr = join(type_to_glsl(return_type), "(", to_expression(sparse_code_id), ", ", to_expression(sparse_texel_id),
		            ")");
		forward = true;
		inherited_expressions.clear();
	}

	emit_op(result_type_id, id, expr, forward);
	for (auto &inherit : inherited_expressions)
		inherit_expression_dependencies(id, inherit);

	// Do not register sparse ops as control dependent as they are always lowered to a temporary.
	switch (op)
	{
	case OpImageSampleDrefImplicitLod:
	case OpImageSampleImplicitLod:
	case OpImageSampleProjImplicitLod:
	case OpImageSampleProjDrefImplicitLod:
		register_control_dependent_expression(id);
		break;

	default:
		break;
	}
}